

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O0

bool ON_SubDVertex::Read(ON_BinaryArchive *archive,ON_SubD *subd,ON_SubDVertex **vertex)

{
  ON_SubDComponentPtr this;
  bool bVar1;
  ON_SubDVertexTag vertex_tag_00;
  uint level;
  int iVar2;
  ON__UINT8 local_b9;
  ON_SubDVertex *pOStack_b8;
  uchar sz;
  ON_SubDVertex *v;
  unsigned_short face_count;
  unsigned_short edge_count;
  double P [3];
  byte local_81;
  undefined1 local_80 [7];
  uchar vertex_tag;
  ON_SubDComponentBase base;
  ON_SubDimple *subdimple;
  ON_SubDVertex **vertex_local;
  ON_SubD *subd_local;
  ON_BinaryArchive *archive_local;
  
  *vertex = (ON_SubDVertex *)0x0;
  base.m_symmetry_set_next.m_ptr = (ON__UINT_PTR)ON_SubD::SubDimple(subd);
  if ((ON_SubDimple *)base.m_symmetry_set_next.m_ptr != (ON_SubDimple *)0x0) {
    memcpy(local_80,&ON_SubDComponentBase::Unset,0x50);
    local_81 = 0;
    v._6_2_ = 0;
    v._4_2_ = 0;
    bVar1 = ReadBase(archive,(ON_SubDComponentBase *)local_80);
    if (((((bVar1) && (bVar1 = ON_BinaryArchive::ReadChar(archive,&local_81), bVar1)) &&
         (bVar1 = Internal_ReadDouble3(archive,(double *)&stack0xffffffffffffff58), bVar1)) &&
        ((bVar1 = ON_BinaryArchive::ReadShort(archive,(ON__UINT16 *)((long)&v + 6)), bVar1 &&
         (bVar1 = ON_BinaryArchive::ReadShort(archive,(ON__UINT16 *)((long)&v + 4)), bVar1)))) &&
       (bVar1 = Internal_IgnoreSavedLimitPointList(archive,(uint)v._4_2_),
       this = base.m_symmetry_set_next, bVar1)) {
      vertex_tag_00 = ON_SubD::VertexTagFromUnsigned((uint)local_81);
      level = ON_SubDComponentBase::SubdivisionLevel((ON_SubDComponentBase *)local_80);
      pOStack_b8 = ON_SubDimple::AllocateVertex
                             ((ON_SubDimple *)this.m_ptr,(uint)base.m_subd_point1,vertex_tag_00,
                              level,(double *)&stack0xffffffffffffff58,(uint)v._6_2_,(uint)v._4_2_);
      if (pOStack_b8 != (ON_SubDVertex *)0x0) {
        memcpy(pOStack_b8,local_80,0x50);
        bVar1 = Internal_ReadEdgePtrList
                          (archive,(unsigned_short *)((long)&v + 6),pOStack_b8->m_edge_capacity,
                           pOStack_b8->m_edges,0,(ON_SubDEdgePtr *)0x0);
        if (bVar1) {
          pOStack_b8->m_edge_count = v._6_2_;
          bVar1 = Internal_ReadFacePtrList
                            (archive,(unsigned_short *)((long)&v + 4),pOStack_b8->m_face_capacity,
                             (ON_SubDFacePtr *)pOStack_b8->m_faces,0,(ON_SubDFacePtr *)0x0);
          if (bVar1) {
            pOStack_b8->m_face_count = v._4_2_;
            *vertex = pOStack_b8;
            iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
            if (0x45 < iVar2) {
              bVar1 = Internal_FinishReadingComponentAdditions(archive);
              return bVar1;
            }
            local_b9 = '\x01';
            bVar1 = ON_BinaryArchive::ReadChar(archive,&local_b9);
            if ((bVar1) && (local_b9 == '\0')) {
              return true;
            }
          }
        }
      }
    }
  }
  ON_SubDIncrementErrorCount();
  return false;
}

Assistant:

bool ON_SubDVertex::Read(
  class ON_BinaryArchive& archive,
  class ON_SubD& subd,
  class ON_SubDVertex*& vertex
  )
{
  vertex = nullptr;

  for (;;)
  {
    ON_SubDimple* subdimple = const_cast<ON_SubDimple*>(subd.SubDimple());
    if ( nullptr == subdimple)
      break;

    ON_SubDComponentBase base = ON_SubDComponentBase::Unset;
    unsigned char vertex_tag = 0;
    //unsigned char vertex_edge_order = 0;
    //unsigned char vertex_facet_type = 0;
    double P[3];
    unsigned short edge_count = 0;
    unsigned short face_count = 0;

    //ON_SimpleArray<ON_SubDSectorSurfacePoint> limit_points;

    if (!ReadBase(archive,base))
      break;
    if (!archive.ReadChar(&vertex_tag))
      break;
    if (!Internal_ReadDouble3(archive,P))
      break;
    if (!archive.ReadShort(&edge_count))
      break;
    if (!archive.ReadShort(&face_count))
      break;

    if (!Internal_IgnoreSavedLimitPointList(archive, face_count))
      break;

    ON_SubDVertex* v = subdimple->AllocateVertex(
      base.m_id, // serialization must preserve ON_SubDVertex.m_id
      ON_SubD::VertexTagFromUnsigned(vertex_tag),
      base.SubdivisionLevel(),
      P,
      edge_count,
      face_count
      );

    if ( nullptr == v )
      break;

    v->ON_SubDComponentBase::operator=(base);

    if (!Internal_ReadEdgePtrList(archive,edge_count,v->m_edge_capacity,v->m_edges,0,nullptr))
      break;
    v->m_edge_count = edge_count;

    if (!Internal_ReadFacePtrList(archive,face_count,v->m_face_capacity,(ON_SubDFacePtr*)v->m_faces,0,nullptr))
      break;
    v->m_face_count = face_count;

    //for (unsigned int i = 0; i < limit_points.UnsignedCount(); i++)
    //{
    //  ON_SubDSectorSurfacePoint limit_point = limit_points[i];
    //  limit_point.m_next_sector_limit_point = (const ON_SubDSectorSurfacePoint*)1U; // skips checks
    //  if (false == v->SetSavedSurfacePoint( true, limit_point))
    //  {
    //    v->ClearSavedSurfacePoints();
    //    break;
    //  }
    //}

    vertex = v;

    if (archive.Archive3dmVersion() < 70)
    {
      unsigned char sz = 1;
      if (!archive.ReadChar(&sz) || 0 != sz)
        break;
      return true;
    }

    // read additions
    return Internal_FinishReadingComponentAdditions(archive);
  }
  return ON_SUBD_RETURN_ERROR(false);
}